

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O3

void __thiscall benchmark::State::SetLabel(State *this,char *label)

{
  size_type sVar1;
  MutexLock l;
  unique_lock<std::mutex> local_28;
  
  if ((anonymous_namespace)::running_benchmark != '\0') {
    internal::GetNullLogInstance();
    if (GetBenchmarkLock()::lock == '\0') {
      SetLabel();
    }
    local_28._M_device = (mutex_type *)GetBenchmarkLock()::lock;
    local_28._M_owns = false;
    std::unique_lock<std::mutex>::lock(&local_28);
    local_28._M_owns = true;
    (anonymous_namespace)::GetReportLabel_abi_cxx11_();
    sVar1 = (anonymous_namespace)::GetReportLabel[abi:cxx11]()::label_abi_cxx11_._M_string_length;
    strlen(label);
    std::__cxx11::string::_M_replace(0x1429e0,0,(char *)sVar1,(ulong)label);
    std::unique_lock<std::mutex>::~unique_lock(&local_28);
    return;
  }
  internal::CheckHandler::CheckHandler
            ((CheckHandler *)&local_28,"running_benchmark",
             "/workspace/llm4binary/github/license_c_cmakelists/jtomschroeder[P]lambda/vendor/benchmark/src/benchmark.cc"
             ,"SetLabel",0x3f4);
  internal::CheckHandler::~CheckHandler((CheckHandler *)&local_28);
}

Assistant:

void State::SetLabel(const char* label) {
  CHECK(running_benchmark);
  MutexLock l(GetBenchmarkLock());
  *GetReportLabel() = label;
}